

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::EnumLiteGenerator::Generate
          (EnumLiteGenerator *this,Printer *printer)

{
  bool immutable;
  Context *context;
  pointer ppEVar1;
  EnumValueDescriptor *pEVar2;
  string *value1;
  EnumLiteGenerator *pEVar3;
  Printer *pPVar4;
  mapped_type *pmVar5;
  EnumDescriptor *pEVar6;
  int i_00;
  int i_01;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  int i;
  ulong uVar8;
  long lVar9;
  long lVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  allocator local_b9;
  EnumLiteGenerator *local_b8;
  Printer *local_b0;
  undefined1 local_a8 [32];
  _Base_ptr local_88;
  size_t local_80;
  string local_78;
  long local_58;
  key_type local_50;
  
  WriteEnumDocComment(printer,this->descriptor_);
  context = this->context_;
  pEVar6 = this->descriptor_;
  immutable = this->immutable_api_;
  std::__cxx11::string::string((string *)local_a8,"",(allocator *)&local_78);
  MaybePrintGeneratedAnnotation<google::protobuf::EnumDescriptor_const>
            (context,printer,pEVar6,immutable,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  io::Printer::Print(printer,
                     "public enum $classname$\n    implements com.google.protobuf.Internal.EnumLite {\n"
                     ,"classname",*(string **)this->descriptor_);
  local_b8 = this;
  io::Printer::Annotate<google::protobuf::EnumDescriptor>(printer,"classname",this->descriptor_);
  local_b0 = printer;
  io::Printer::Indent(printer);
  for (uVar8 = 0; pPVar4 = local_b0,
      uVar8 < (ulong)((long)(local_b8->canonical_values_).
                            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_b8->canonical_values_).
                            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    local_a8._8_4_ = _S_red;
    local_a8._16_8_ = 0;
    local_a8._24_8_ = local_a8 + 8;
    local_80 = 0;
    local_88 = (_Base_ptr)local_a8._24_8_;
    std::__cxx11::string::string((string *)&local_78,"name",(allocator *)&local_50);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a8,&local_78);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&local_78);
    SimpleItoa_abi_cxx11_
              (&local_78,
               (protobuf *)
               (ulong)*(uint *)((local_b8->canonical_values_).
                                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar8] + 0x10),i_00);
    std::__cxx11::string::string((string *)&local_50,"number",&local_b9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a8,&local_50);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_78);
    WriteEnumValueDocComment
              (local_b0,(local_b8->canonical_values_).
                        super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar8]);
    if (*(char *)(*(long *)((local_b8->canonical_values_).
                            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar8] + 0x20) + 0x68) ==
        '\x01') {
      io::Printer::Print(local_b0,"@java.lang.Deprecated\n");
    }
    io::Printer::Print(local_b0,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_a8,"$name$($number$),\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_a8);
  }
  if (*(int *)(*(long *)(local_b8->descriptor_ + 0x10) + 0x8c) == 3) {
    io::Printer::Print(local_b0,"UNRECOGNIZED(-1),\n");
  }
  io::Printer::Print(pPVar4,";\n\n");
  lVar10 = 0;
  for (uVar8 = 0;
      uVar8 < (ulong)((long)(local_b8->aliases_).
                            super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_b8->aliases_).
                            super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar8 = uVar8 + 1) {
    local_a8._8_4_ = _S_red;
    local_a8._16_8_ = 0;
    local_a8._24_8_ = local_a8 + 8;
    local_80 = 0;
    local_88 = (_Base_ptr)local_a8._24_8_;
    std::__cxx11::string::string((string *)&local_78,"classname",(allocator *)&local_50);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a8,&local_78);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string((string *)&local_78,"name",(allocator *)&local_50);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a8,&local_78);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string((string *)&local_78,"canonical_name",(allocator *)&local_50);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a8,&local_78);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&local_78);
    pPVar4 = local_b0;
    WriteEnumValueDocComment
              (local_b0,*(EnumValueDescriptor **)
                         ((long)&((local_b8->aliases_).
                                  super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->value + lVar10));
    io::Printer::Print(pPVar4,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_a8,
                       "public static final $classname$ $name$ = $canonical_name$;\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_a8);
    lVar10 = lVar10 + 0x10;
  }
  lVar10 = 0;
  lVar9 = 0;
  while (pPVar4 = local_b0, pEVar3 = local_b8, lVar9 < *(int *)(local_b8->descriptor_ + 0x2c)) {
    local_a8._8_4_ = _S_red;
    local_a8._16_8_ = 0;
    local_a8._24_8_ = local_a8 + 8;
    local_80 = 0;
    local_88 = (_Base_ptr)local_a8._24_8_;
    local_58 = lVar9;
    std::__cxx11::string::string((string *)&local_78,"name",(allocator *)&local_50);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a8,&local_78);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&local_78);
    SimpleItoa_abi_cxx11_
              (&local_78,
               (protobuf *)(ulong)*(uint *)(*(long *)(local_b8->descriptor_ + 0x30) + 0x10 + lVar10)
               ,i_01);
    std::__cxx11::string::string((string *)&local_50,"number",&local_b9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a8,&local_50);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_78);
    pPVar4 = local_b0;
    WriteEnumValueDocComment
              (local_b0,(EnumValueDescriptor *)(*(long *)(local_b8->descriptor_ + 0x30) + lVar10));
    io::Printer::Print(pPVar4,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_a8,"public static final int $name$_VALUE = $number$;\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_a8);
    lVar10 = lVar10 + 0x28;
    lVar9 = local_58 + 1;
  }
  io::Printer::Print(local_b0,"\n");
  io::Printer::Print(pPVar4,"\npublic final int getNumber() {\n");
  pEVar6 = pEVar3->descriptor_;
  if (*(int *)(*(long *)(pEVar6 + 0x10) + 0x8c) == 3) {
    io::Printer::Print(pPVar4,
                       "  if (this == UNRECOGNIZED) {\n    throw new java.lang.IllegalArgumentException(\n        \"Can\'t get the number of an unknown enum value.\");\n  }\n"
                      );
    pEVar6 = pEVar3->descriptor_;
  }
  io::Printer::Print(pPVar4,
                     "  return value;\n}\n\n/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $classname$ valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $classname$ forNumber(int value) {\n  switch (value) {\n"
                     ,"classname",*(string **)pEVar6);
  io::Printer::Indent(pPVar4);
  io::Printer::Indent(pPVar4);
  uVar7 = extraout_RDX;
  for (uVar8 = 0; pPVar4 = local_b0,
      ppEVar1 = (local_b8->canonical_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(local_b8->canonical_values_).
                            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3);
      uVar8 = uVar8 + 1) {
    pEVar2 = ppEVar1[uVar8];
    value1 = *(string **)pEVar2;
    SimpleItoa_abi_cxx11_((string *)local_a8,(protobuf *)(ulong)*(uint *)(pEVar2 + 0x10),(int)uVar7)
    ;
    io::Printer::Print(local_b0,"case $number$: return $name$;\n","name",value1,"number",
                       (string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    uVar7 = extraout_RDX_00;
  }
  io::Printer::Outdent(local_b0);
  io::Printer::Outdent(pPVar4);
  pEVar3 = local_b8;
  io::Printer::Print(pPVar4,
                     "    default: return null;\n  }\n}\n\npublic static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n    internalGetValueMap() {\n  return internalValueMap;\n}\nprivate static final com.google.protobuf.Internal.EnumLiteMap<\n    $classname$> internalValueMap =\n      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n        public $classname$ findValueByNumber(int number) {\n          return $classname$.forNumber(number);\n        }\n      };\n\n"
                     ,"classname",*(string **)local_b8->descriptor_);
  io::Printer::Print(pPVar4,"private final int value;\n\nprivate $classname$(int value) {\n",
                     "classname",*(string **)pEVar3->descriptor_);
  io::Printer::Print(pPVar4,"  this.value = value;\n}\n");
  io::Printer::Print(pPVar4,"\n// @@protoc_insertion_point(enum_scope:$full_name$)\n","full_name",
                     *(string **)(pEVar3->descriptor_ + 8));
  io::Printer::Outdent(pPVar4);
  io::Printer::Print(pPVar4,"}\n\n");
  return;
}

Assistant:

void EnumLiteGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_, immutable_api_);
  printer->Print(
      "public enum $classname$\n"
      "    implements com.google.protobuf.Internal.EnumLite {\n",
      "classname", descriptor_->name());
  printer->Annotate("classname", descriptor_);
  printer->Indent();

  for (int i = 0; i < canonical_values_.size(); i++) {
    std::map<string, string> vars;
    vars["name"] = canonical_values_[i]->name();
    vars["number"] = SimpleItoa(canonical_values_[i]->number());
    WriteEnumValueDocComment(printer, canonical_values_[i]);
    if (canonical_values_[i]->options().deprecated()) {
      printer->Print("@java.lang.Deprecated\n");
    }
    printer->Print(vars,
      "$name$($number$),\n");
  }

  if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print("UNRECOGNIZED(-1),\n");
  }

  printer->Print(
    ";\n"
    "\n");

  // -----------------------------------------------------------------

  for (int i = 0; i < aliases_.size(); i++) {
    std::map<string, string> vars;
    vars["classname"] = descriptor_->name();
    vars["name"] = aliases_[i].value->name();
    vars["canonical_name"] = aliases_[i].canonical_value->name();
    WriteEnumValueDocComment(printer, aliases_[i].value);
    printer->Print(vars,
      "public static final $classname$ $name$ = $canonical_name$;\n");
  }

  for (int i = 0; i < descriptor_->value_count(); i++) {
    std::map<string, string> vars;
    vars["name"] = descriptor_->value(i)->name();
    vars["number"] = SimpleItoa(descriptor_->value(i)->number());
    WriteEnumValueDocComment(printer, descriptor_->value(i));
    printer->Print(vars,
      "public static final int $name$_VALUE = $number$;\n");
  }
  printer->Print("\n");

  // -----------------------------------------------------------------

  printer->Print(
      "\n"
      "public final int getNumber() {\n");
  if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(
        "  if (this == UNRECOGNIZED) {\n"
        "    throw new java.lang.IllegalArgumentException(\n"
        "        \"Can't get the number of an unknown enum value.\");\n"
        "  }\n");
  }
  printer->Print(
      "  return value;\n"
      "}\n"
      "\n"
      "/**\n"
      " * @deprecated Use {@link #forNumber(int)} instead.\n"
      " */\n"
      "@java.lang.Deprecated\n"
      "public static $classname$ valueOf(int value) {\n"
      "  return forNumber(value);\n"
      "}\n"
      "\n"
      "public static $classname$ forNumber(int value) {\n"
      "  switch (value) {\n",
      "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < canonical_values_.size(); i++) {
    printer->Print(
      "case $number$: return $name$;\n",
      "name", canonical_values_[i]->name(),
      "number", SimpleItoa(canonical_values_[i]->number()));
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
    "    default: return null;\n"
    "  }\n"
    "}\n"
    "\n"
    "public static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n"
    "    internalGetValueMap() {\n"
    "  return internalValueMap;\n"
    "}\n"
    "private static final com.google.protobuf.Internal.EnumLiteMap<\n"
    "    $classname$> internalValueMap =\n"
    "      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n"
    "        public $classname$ findValueByNumber(int number) {\n"
    "          return $classname$.forNumber(number);\n"
    "        }\n"
    "      };\n"
    "\n",
    "classname", descriptor_->name());

  printer->Print(
    "private final int value;\n\n"
    "private $classname$(int value) {\n",
    "classname", descriptor_->name());
  printer->Print(
    "  this.value = value;\n"
    "}\n");

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(enum_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}